

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrins.cpp
# Opt level: O2

long c_scan(long num,long degree,long res)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  int *piVar10;
  ulong uVar11;
  ulong uVar12;
  bool bVar13;
  bool bVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  long local_60;
  
  if (3 < (ulong)num) {
    __assert_fail("num >= 0 && num <= 3",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/VladlenPopolitov[P]ForthScriptCpp/examples/ForthRobots/intrins.cpp"
                  ,0x1a,"long c_scan(long, long, long)");
  }
  uVar11 = 10;
  if ((ulong)res < 10) {
    uVar11 = res;
  }
  if (res < 0) {
    uVar11 = 0;
  }
  uVar7 = -degree;
  if (0 < degree) {
    uVar7 = degree;
  }
  uVar9 = uVar7 % 0x168;
  if (uVar7 < 0x168) {
    uVar9 = uVar7;
  }
  robots[num].scan = (int)uVar9;
  bVar13 = uVar9 < 0x168 - uVar11;
  uVar7 = uVar9 + 0xb4;
  if (bVar13 && uVar11 < uVar9) {
    uVar7 = uVar9;
  }
  piVar10 = &robots[0].y;
  uVar12 = 0;
  local_60 = 0;
  do {
    if (uVar12 == 4) {
      return local_60;
    }
    if ((num != uVar12) && (((robot *)(piVar10 + -6))->status != 0)) {
      iVar1 = robots[num].x;
      iVar2 = robots[num].y;
      iVar3 = piVar10[-1];
      iVar4 = *piVar10;
      iVar5 = iVar3 / -10 + iVar1 / 10;
      fVar16 = (float)iVar5;
      fVar17 = (float)(iVar4 / -10 + iVar2 / 10);
      if ((int)((double)iVar5 + 0.5) == 0) {
        lVar8 = 0x10e;
        if (iVar2 < iVar4) {
          lVar8 = 0x5a;
        }
      }
      else {
        fVar15 = atanf(fVar17 / fVar16);
        if (iVar4 < iVar2) {
          if (iVar1 < iVar3) {
            fVar15 = fVar15 * 57.29578 + 360.0;
          }
          else {
LAB_00130eaf:
            fVar15 = fVar15 * 57.29578 + 180.0;
          }
        }
        else {
          if (iVar3 <= iVar1) goto LAB_00130eaf;
          fVar15 = fVar15 * 57.29578;
        }
        lVar8 = (long)fVar15;
      }
      lVar6 = lVar8 + 0xb4;
      if (bVar13 && uVar11 < uVar9) {
        lVar6 = lVar8;
      }
      if (r_debug != 0) {
        printf("\nscan: degree; %ld; bounds %ld, %ld; robot %d; deg %ld\n",uVar9,lVar6 - uVar11,
               lVar6 + uVar11,uVar12 & 0xffffffff);
      }
      if (((long)(lVar6 - uVar11) <= (long)uVar7) && ((long)uVar7 <= (long)(lVar6 + uVar11))) {
        fVar16 = SQRT(fVar16 * fVar16 + fVar17 * fVar17);
        lVar6 = (long)fVar16;
        lVar8 = local_60;
        if (fVar16 < (float)local_60) {
          lVar8 = lVar6;
        }
        bVar14 = local_60 == 0;
        local_60 = lVar8;
        if (bVar14) {
          local_60 = lVar6;
        }
      }
    }
    uVar12 = uVar12 + 1;
    piVar10 = piVar10 + 0x2e;
  } while( true );
}

Assistant:

long c_scan(long num, long degree, long res)
{
  assert(num >= 0 && num <= 3);
  struct robot *cur_robot = &robots[num];

  int i;

  float distance;
  long close_dist = 0L;
  float x, y;
  long d, dd, d1, d2;

  /* get degree of scan resolution, up to limit */
  // res = pop();
  if (res < 0L)
    res = 0L;
  else if (res > RES_LIMIT)
    res = RES_LIMIT;

  /* get scan direction */
  // degree = pop();
  if (degree < 0L)
    degree = -degree;
  if (degree >= 360L)
    degree %= 360L;

  cur_robot->scan = (int)degree; /* record scan for display */

  /* check other robots for +/- resolution */
  for (i = 0; i < MAXROBOTS; i++)
  {
    if (cur_robot == &robots[i] || robots[i].status == DEAD)
      continue; /* skip current or dead robots */
    /* find relative degree angle */
    x = (cur_robot->x / CLICK) - (robots[i].x / CLICK);
    y = (cur_robot->y / CLICK) - (robots[i].y / CLICK);
    if ((int)(x + 0.5) == 0)
      /* avoid division by zero */
      d = (robots[i].y > cur_robot->y) ? 90 : 270;
    else
    {
      if (robots[i].y < cur_robot->y)
      {
        if (robots[i].x > cur_robot->x)
          d = 360.0 + (RAD_DEG * atan(y / x)); /* relative quadrant 4 */
        else
          d = 180.0 + (RAD_DEG * atan(y / x)); /* relative quadrant 3 */
      }
      else
      {
        if (robots[i].x > cur_robot->x)
          d = RAD_DEG * atan(y / x); /* relative quadrant 1 */
        else
          d = 180.0 + (RAD_DEG * atan(y / x)); /* relative quadrant 2 */
      }
    }

    /* find out if robot tested is within the scan resolution */
    if (degree > res && degree < 360 - res)
    {
      dd = degree;
      d1 = d - res;
      d2 = d + res;
    }
    else
    {
      /* on 0 and 360 boundary, bring back into linear resolution */
      dd = degree + 180;
      d1 = 180 + d - res;
      d2 = 180 + d + res;
    }

    if (r_debug)
      printf("\nscan: degree; %ld; bounds %ld, %ld; robot %d; deg %ld\n",
             degree, d1, d2, i, d);

    if (dd >= d1 && dd <= d2)
    {
      /* this robot is within scan, so get his distance */
      distance = sqrt((x * x) + (y * y));
      /* only get the closest distance, when two or more robots are in scan */
      if (distance < close_dist || close_dist == 0L)
        close_dist = distance;
    }
  }
  return ((long)close_dist);
}